

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O0

void __thiscall
Zuker::lambda_swipe_3(Zuker *this,double threshold,double threshold2,ostream *fout,string *outfile)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  reference pvVar8;
  size_type sVar9;
  void *pvVar10;
  ostream *poVar11;
  ostream *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  ostream *in_RSI;
  Zuker *in_RDI;
  double in_XMM0_Qa;
  double dVar12;
  Zuker *pZVar13;
  double dVar14;
  double in_XMM1_Qa;
  double in_stack_00000108;
  Zuker *in_stack_00000110;
  double m_1;
  double m;
  double right_O;
  double left_O;
  string right_bp;
  string right_rna;
  string left_bp;
  string left_rna;
  int idx;
  double right_mfe;
  double right_cai;
  double right_CAI;
  double left_mfe;
  double left_cai;
  double left_CAI;
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  cai_map;
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  mfe_map;
  queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  lambda;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  dataset;
  vector<double,_std::allocator<double>_> C_buffer;
  vector<double,_std::allocator<double>_> MFE_buffer;
  vector<double,_std::allocator<double>_> stand_CAI;
  vector<double,_std::allocator<double>_> CAI_buffer;
  vector<double,_std::allocator<double>_> F_buffer;
  vector<double,_std::allocator<double>_> lambda_buffer;
  vector<double,_std::allocator<double>_> O_buffer;
  double right_lambda;
  double left_lambda;
  int in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffff850;
  char (*in_stack_fffffffffffff858) [8];
  allocator_type *in_stack_fffffffffffff860;
  string *in_stack_fffffffffffff868;
  Zuker *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff888;
  Zuker *in_stack_fffffffffffff890;
  void *in_stack_fffffffffffff8a0;
  ostream *in_stack_fffffffffffff8a8;
  undefined6 in_stack_fffffffffffff8b0;
  undefined1 in_stack_fffffffffffff8b6;
  undefined1 in_stack_fffffffffffff8b7;
  Zuker *in_stack_fffffffffffff8d0;
  string *in_stack_fffffffffffff9c0;
  ostream *in_stack_fffffffffffffa78;
  ostream *in_stack_fffffffffffffa80;
  string local_450 [103];
  undefined1 local_3e9;
  pair<double,_double> local_348;
  pair<double,_double> local_338;
  double local_328;
  pair<double,_double> local_320;
  pair<double,_double> local_310;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [36];
  int local_224;
  double local_220;
  double local_218;
  pair<double,_double> local_210;
  double local_200;
  string *local_1f8;
  double lambda_00;
  ostream *poVar15;
  Zuker *this_02;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_f8 [8];
  double local_38;
  double local_30 [2];
  ostream *local_20;
  double local_18;
  double local_10;
  
  local_20 = in_RSI;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1776ae);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1776bb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1776c8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1776d5);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1776e2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1776ef);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1776fc);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
               *)0x177711);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
            *)in_stack_fffffffffffff870,(size_type)in_stack_fffffffffffff868,
           in_stack_fffffffffffff860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
                *)0x17773a);
  std::
  queue<std::pair<double,double>,std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
  ::queue<std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>,void>
            ((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
              *)in_stack_fffffffffffff850);
  std::
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  ::unordered_map((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                   *)0x177756);
  std::
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  ::unordered_map((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                   *)0x177763);
  this_02 = (Zuker *)0x0;
  poVar15 = (ostream *)0x0;
  lambda_00 = 10000000.0;
  local_1f8 = (string *)0x416312d000000000;
  local_200 = 10000000.0;
  local_218 = 1e-05;
  local_220 = 0.99999;
  std::pair<double,_double>::pair<double,_double,_true>(&local_210,&local_218,&local_220);
  std::
  queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  ::push((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
          *)in_stack_fffffffffffff850,
         (value_type *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  while (bVar3 = std::
                 queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                 ::empty((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                          *)0x177812), ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
             ::front((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                      *)0x17783a);
    local_30[0] = pvVar4->first;
    pvVar4 = std::
             queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
             ::front((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                      *)0x177866);
    local_38 = pvVar4->second;
    std::
    queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
    ::pop((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
           *)0x177893);
    iVar1 = in_RDI->n;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,(long)(iVar1 * 3),'.',&local_249);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    iVar1 = in_RDI->n;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,(long)(iVar1 * 3),'.',&local_271);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    iVar1 = in_RDI->n;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,(long)(iVar1 * 3),'.',&local_299);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    iVar1 = in_RDI->n;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,(long)(iVar1 * 3),'.',&local_2c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    sVar5 = std::
            unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
            ::count((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                     *)in_stack_fffffffffffff850,
                    (key_type *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
    if (sVar5 == 0) {
      reinit(in_stack_fffffffffffff8d0);
      poVar11 = std::operator<<(local_20,"lambda: ");
      pvVar10 = (void *)std::ostream::operator<<(poVar11,local_30[0]);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      local_2d0 = calculate_CAI_O(this_02,poVar15,lambda_00);
      traceback_B2(in_stack_00000110,in_stack_00000108);
      get_rna_cai(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
      get_bp(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      dVar12 = evaluate_CAI((string *)
                            CONCAT17(in_stack_fffffffffffff8b7,
                                     CONCAT16(in_stack_fffffffffffff8b6,in_stack_fffffffffffff8b0)),
                            (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a8,
                            (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
      pZVar13 = (Zuker *)evaluate_CAI((string *)
                                      CONCAT17(in_stack_fffffffffffff8b7,
                                               CONCAT16(in_stack_fffffffffffff8b6,
                                                        in_stack_fffffffffffff8b0)),
                                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a8
                                      ,(int)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
      poVar11 = (ostream *)evaluate_MFE(in_stack_fffffffffffff9c0);
      poVar15 = poVar11;
      pmVar6 = std::
               unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::operator[]((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                             *)in_stack_fffffffffffff850,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      *pmVar6 = (mapped_type)poVar11;
      this_02 = pZVar13;
      pmVar6 = std::
               unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::operator[]((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                             *)in_stack_fffffffffffff850,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      *pmVar6 = (mapped_type)pZVar13;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      in_stack_fffffffffffff848 = in_RDI->minY;
      pcVar7 = index(in_RDI,(char *)0x0,in_RDI->n + -1);
      local_224 = (int)pcVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Z2,(long)local_224)
      ;
      local_2d8 = *pvVar8 / local_30[0];
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Z_CAI,(long)local_224);
      local_2e0 = *pvVar8 / (local_30[0] + -1.0);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      poVar11 = std::operator<<(local_20,"rna: ");
      poVar11 = std::operator<<(poVar11,local_248);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      poVar11 = std::operator<<(local_20,"bp: ");
      poVar11 = std::operator<<(poVar11,local_270);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      poVar11 = std::operator<<((ostream *)&std::cout,"lambda: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_30[0]);
      poVar11 = std::operator<<(poVar11,",O: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_2d0);
      poVar11 = std::operator<<(poVar11,",cai: ");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Z_CAI,(long)local_224);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar8 / (local_30[0] + -1.0));
      in_stack_fffffffffffffa80 = std::operator<<(poVar11,",mfe: ");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Z2,(long)local_224)
      ;
      in_stack_fffffffffffffa78 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffa80,*pvVar8 / local_30[0]);
      poVar11 = std::operator<<(in_stack_fffffffffffffa78,",integrated: ");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Z2,(long)local_224)
      ;
      dVar14 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Z_CAI,(long)local_224);
      pvVar10 = (void *)std::ostream::operator<<(poVar11,dVar14 + *pvVar8);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      poVar11 = std::operator<<((ostream *)&std::cout,"lambda: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_30[0]);
      poVar11 = std::operator<<(poVar11,",O: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_2d0);
      poVar11 = std::operator<<(poVar11,",cai: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,dVar12);
      poVar11 = std::operator<<(poVar11,",sCAI: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(double)this_02);
      poVar11 = std::operator<<(poVar11,",mfe: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(double)poVar15);
      poVar11 = std::operator<<(poVar11,",combined: ");
      pvVar10 = (void *)std::ostream::operator<<
                                  (poVar11,local_30[0] * (double)poVar15 +
                                           (local_30[0] + -1.0) * dVar12);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
    else {
      pmVar6 = std::
               unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::operator[]((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                             *)in_stack_fffffffffffff850,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      this_02 = (Zuker *)*pmVar6;
      pmVar6 = std::
               unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::operator[]((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                             *)in_stack_fffffffffffff850,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      poVar15 = (ostream *)*pmVar6;
    }
    sVar5 = std::
            unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
            ::count((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                     *)in_stack_fffffffffffff850,
                    (key_type *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
    if (sVar5 == 0) {
      reinit(in_stack_fffffffffffff8d0);
      poVar11 = std::operator<<(local_20,"lambda: ");
      pvVar10 = (void *)std::ostream::operator<<(poVar11,local_38);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      local_2e8 = calculate_CAI_O(this_02,poVar15,lambda_00);
      traceback_B2(in_stack_00000110,in_stack_00000108);
      get_rna_cai(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
      get_bp(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      lambda_00 = evaluate_CAI((string *)
                               CONCAT17(in_stack_fffffffffffff8b7,
                                        CONCAT16(in_stack_fffffffffffff8b6,in_stack_fffffffffffff8b0
                                                )),
                               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a8,
                               (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
      in_stack_fffffffffffff9c0 =
           (string *)
           evaluate_CAI((string *)
                        CONCAT17(in_stack_fffffffffffff8b7,
                                 CONCAT16(in_stack_fffffffffffff8b6,in_stack_fffffffffffff8b0)),
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a8,
                        (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
      local_1f8 = in_stack_fffffffffffff9c0;
      dVar14 = evaluate_MFE(in_stack_fffffffffffff9c0);
      local_200 = dVar14;
      pmVar6 = std::
               unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::operator[]((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                             *)in_stack_fffffffffffff850,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      psVar2 = local_1f8;
      *pmVar6 = dVar14;
      pmVar6 = std::
               unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::operator[]((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                             *)in_stack_fffffffffffff850,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      *pmVar6 = (mapped_type)psVar2;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff860,
                 (value_type_conflict1 *)in_stack_fffffffffffff858);
      in_stack_fffffffffffff848 = in_RDI->minY;
      pcVar7 = index(in_RDI,(char *)0x0,in_RDI->n + -1);
      local_224 = (int)pcVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Z2,(long)local_224)
      ;
      local_2f0 = *pvVar8 / local_38;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Z_CAI,(long)local_224);
      local_2f8 = *pvVar8 / (local_38 + -1.0);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      poVar11 = std::operator<<(local_20,"rna: ");
      poVar11 = std::operator<<(poVar11,local_298);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      poVar11 = std::operator<<(local_20,"bp: ");
      poVar11 = std::operator<<(poVar11,local_2c0);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      poVar11 = std::operator<<((ostream *)&std::cout,"lambda: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_38);
      poVar11 = std::operator<<(poVar11,",O: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_2e8);
      poVar11 = std::operator<<(poVar11,",cai: ");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Z_CAI,(long)local_224);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar8 / (local_38 + -1.0));
      poVar11 = std::operator<<(poVar11,",mfe: ");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Z2,(long)local_224)
      ;
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar8 / local_38);
      poVar11 = std::operator<<(poVar11,",integrated: ");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Z2,(long)local_224)
      ;
      dVar14 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Z_CAI,(long)local_224);
      pvVar10 = (void *)std::ostream::operator<<(poVar11,dVar14 + *pvVar8);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      poVar11 = std::operator<<((ostream *)&std::cout,"lambda: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_38);
      poVar11 = std::operator<<(poVar11,",O: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_2e8);
      poVar11 = std::operator<<(poVar11,",cai: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,lambda_00);
      poVar11 = std::operator<<(poVar11,",sCAI: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(double)local_1f8);
      in_stack_fffffffffffff8d0 = (Zuker *)std::operator<<(poVar11,",mfe: ");
      poVar11 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff8d0,local_200);
      poVar11 = std::operator<<(poVar11,",combined: ");
      pvVar10 = (void *)std::ostream::operator<<
                                  (poVar11,local_38 * local_200 + (local_38 + -1.0) * lambda_00);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
    else {
      pmVar6 = std::
               unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::operator[]((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                             *)in_stack_fffffffffffff850,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      local_1f8 = (string *)*pmVar6;
      pmVar6 = std::
               unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::operator[]((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                             *)in_stack_fffffffffffff850,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      local_200 = *pmVar6;
    }
    in_stack_fffffffffffff8b7 = compare((double)this_02,(double)local_1f8,1e-05);
    if ((!(bool)in_stack_fffffffffffff8b7) &&
       (in_stack_fffffffffffff8b6 = compare((double)poVar15,local_200,1e-05),
       !(bool)in_stack_fffffffffffff8b6)) {
      in_stack_fffffffffffff8a8 = std::operator<<((ostream *)&std::cout,"lamda diff: ");
      in_stack_fffffffffffff8a0 =
           (void *)std::ostream::operator<<(in_stack_fffffffffffff8a8,local_38 - local_30[0]);
      std::ostream::operator<<(in_stack_fffffffffffff8a0,std::endl<char,std::char_traits<char>>);
      if (local_10 <= local_38) {
        bVar3 = compare(local_30[0],local_38,local_10);
        if (!bVar3) {
          local_328 = local_30[0] * 0.4 + local_38 * 0.6;
          std::pair<double,_double>::pair<double_&,_double_&,_true>(&local_338,local_30,&local_328);
          std::
          queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
          ::push((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                  *)in_stack_fffffffffffff850,
                 (value_type *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
          std::pair<double,_double>::pair<double_&,_double_&,_true>(&local_348,&local_328,&local_38)
          ;
          std::
          queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
          ::push((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                  *)in_stack_fffffffffffff850,
                 (value_type *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
        }
      }
      else {
        bVar3 = compare(local_30[0],local_38,local_18);
        if (!bVar3) {
          local_300 = local_30[0] * 0.4 + local_38 * 0.6;
          std::pair<double,_double>::pair<double_&,_double_&,_true>(&local_310,local_30,&local_300);
          std::
          queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
          ::push((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                  *)in_stack_fffffffffffff850,
                 (value_type *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
          std::pair<double,_double>::pair<double_&,_double_&,_true>(&local_320,&local_300,&local_38)
          ;
          std::
          queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
          ::push((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                  *)in_stack_fffffffffffff850,
                 (value_type *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
        }
      }
    }
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string(local_248);
  }
  poVar15 = std::operator<<((ostream *)&std::cout,"size : ");
  sVar9 = std::
          queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
          ::size((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                  *)0x178eea);
  pvVar10 = (void *)std::ostream::operator<<(poVar15,sVar9);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar15 = std::operator<<(local_20,"left lambda: ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar15,local_30[0]);
  this_00 = std::operator<<(poVar11,",right lambda: ");
  this_01 = (vector<double,_std::allocator<double>_> *)std::ostream::operator<<(this_00,local_38);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::make_pair<char_const(&)[7],std::vector<double,std::allocator<double>>&>
            ((char (*) [7])in_stack_fffffffffffff858,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](local_f8,0);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            (in_stack_fffffffffffff850,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x178fe2);
  std::make_pair<char_const(&)[7],std::vector<double,std::allocator<double>>&>
            ((char (*) [7])in_stack_fffffffffffff858,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](local_f8,1);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            (in_stack_fffffffffffff850,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x179031);
  std::make_pair<char_const(&)[7],std::vector<double,std::allocator<double>>&>
            ((char (*) [7])in_stack_fffffffffffff858,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](local_f8,2);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            (in_stack_fffffffffffff850,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x179080);
  std::make_pair<char_const(&)[8],std::vector<double,std::allocator<double>>&>
            (in_stack_fffffffffffff858,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](local_f8,3);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            (in_stack_fffffffffffff850,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x1790cf);
  local_3e9 = 0x4f;
  std::make_pair<char,std::vector<double,std::allocator<double>>&>
            (*in_stack_fffffffffffff858,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](local_f8,4);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            (in_stack_fffffffffffff850,
             (pair<char,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  std::pair<char,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<char,_std::vector<double,_std::allocator<double>_>_> *)0x179127);
  std::make_pair<char_const(&)[4],std::vector<double,std::allocator<double>>&>
            ((char (*) [4])in_stack_fffffffffffff858,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](local_f8,5);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            (in_stack_fffffffffffff850,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x179176);
  std::make_pair<char_const(&)[4],std::vector<double,std::allocator<double>>&>
            ((char (*) [4])in_stack_fffffffffffff858,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](local_f8,6);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            (in_stack_fffffffffffff850,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x1791c5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar15,
                 (char *)poVar11);
  write_csv((string *)in_stack_fffffffffffffa80,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             *)in_stack_fffffffffffffa78);
  std::__cxx11::string::~string(local_450);
  poVar15 = std::operator<<((ostream *)&std::cout,"swipe done");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  std::
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  ::~unordered_map((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                    *)0x179241);
  std::
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  ::~unordered_map((unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
                    *)0x17924e);
  std::
  queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  ::~queue((queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
            *)0x17925b);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             *)this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  return;
}

Assistant:

void Zuker::lambda_swipe_3(double threshold, double threshold2, ostream &fout, string & outfile) {
    double left_lambda;
    double right_lambda;
    vector<double> O_buffer,lambda_buffer,F_buffer,CAI_buffer,stand_CAI;
    vector<double> MFE_buffer, C_buffer;
    vector<pair<string, vector<double>>> dataset(7);
    queue<pair<double, double>> lambda;
    unordered_map<double, double> mfe_map;
    unordered_map<double, double> cai_map;
    double left_CAI = 0, left_cai = 0, left_mfe = 0, right_CAI = inf, right_cai = inf, right_mfe = inf;

    lambda.push({EPSILON,1-EPSILON});
    int idx;

    while (!lambda.empty()) {
        left_lambda=  lambda.front().first, right_lambda = lambda.front().second;
        lambda.pop();
        string left_rna(3*n, '.'), left_bp(3*n, '.'), right_rna(3*n, '.'), right_bp(3*n, '.');
        if (mfe_map.count(left_lambda) != 0) {
            left_cai = cai_map[left_lambda];
            left_mfe = mfe_map[left_lambda];
        } else {
            reinit();
            fout << "lambda: " << left_lambda << endl;
            double left_O = calculate_CAI_O(fout,left_lambda);
            traceback_B2(left_lambda);
            get_rna_cai(left_rna);
            get_bp(left_bp);
            left_CAI = evaluate_CAI(left_rna, protein, 1);
            left_cai = evaluate_CAI(left_rna, protein, 0);
            left_mfe = evaluate_MFE(left_rna);
            mfe_map[left_lambda] = left_mfe;
            cai_map[left_lambda] = left_cai;
            O_buffer.push_back(left_O);
            lambda_buffer.push_back(left_lambda);
            F_buffer.push_back(left_mfe);
            CAI_buffer.push_back(left_CAI);
            stand_CAI.push_back(left_cai);
            idx = index(0, n-1, 0, 2, minX, minY);
            MFE_buffer.push_back(Z2[idx] / left_lambda);
            C_buffer.push_back(Z_CAI[idx] / (left_lambda-1));
            fout << "rna: " << left_rna << endl;
            fout << "bp: " << left_bp << endl;
            cout << "lambda: " << left_lambda << ",O: " << left_O << ",cai: " << Z_CAI[idx] / (left_lambda-1) << ",mfe: " << Z2[idx] / left_lambda << ",integrated: " << Z2[idx] + Z_CAI[idx] << endl;
            cout << "lambda: " << left_lambda << ",O: " << left_O << ",cai: " << left_CAI << ",sCAI: " << left_cai << ",mfe: " << left_mfe << ",combined: " << left_lambda*left_mfe+(left_lambda-1)*left_CAI << endl;

        }

        if (mfe_map.count(right_lambda) != 0) {
            right_cai = cai_map[right_lambda];
            right_mfe = mfe_map[right_lambda];
        } else {
            reinit();
            fout << "lambda: " << right_lambda << endl;
            double right_O = calculate_CAI_O(fout,right_lambda);
            traceback_B2(right_lambda);
            get_rna_cai(right_rna);
            get_bp(right_bp);
            right_CAI = evaluate_CAI(right_rna, protein, 1);
            right_cai = evaluate_CAI(right_rna, protein, 0);
            right_mfe = evaluate_MFE(right_rna);
            mfe_map[right_lambda] = right_mfe;
            cai_map[right_lambda] = right_cai;
            O_buffer.push_back(right_O);
            lambda_buffer.push_back(right_lambda);
            F_buffer.push_back(right_mfe);
            CAI_buffer.push_back(right_CAI);
            stand_CAI.push_back(right_cai);
            idx = index(0, n-1, 0, 2, minX, minY);
            MFE_buffer.push_back(Z2[idx] / right_lambda);
            C_buffer.push_back(Z_CAI[idx] / (right_lambda-1));
            fout << "rna: " << right_rna << endl;
            fout << "bp: " << right_bp << endl;
            cout << "lambda: " << right_lambda << ",O: " << right_O << ",cai: " << Z_CAI[idx] / (right_lambda-1) << ",mfe: " << Z2[idx] / right_lambda << ",integrated: " << Z2[idx] + Z_CAI[idx] << endl;
            cout << "lambda: " << right_lambda << ",O: " << right_O << ",cai: " << right_CAI << ",sCAI: " << right_cai << ",mfe: " << right_mfe << ",combined: " << right_lambda*right_mfe+(right_lambda-1)*right_CAI << endl;

        }
        if (!compare(left_cai, right_cai) && !compare(left_mfe, right_mfe)) {
            cout << "lamda diff: " << right_lambda-left_lambda << endl;
            if (right_lambda < threshold) {
                if (!compare(left_lambda,right_lambda,threshold2)) {
                    double m = left_lambda * 0.4 + right_lambda * 0.6;
                    lambda.push({left_lambda, m});
                    lambda.push({m, right_lambda});
                }
            } else {
                if (!compare(left_lambda,right_lambda,threshold)) {
                    double m = left_lambda * 0.4 + right_lambda * 0.6;
                    lambda.push({left_lambda, m});
                    lambda.push({m, right_lambda});
                }
            }

        }
    }
    cout << "size : " << lambda.size() << endl;
    fout << "left lambda: " << left_lambda << ",right lambda: " << right_lambda << endl;
    dataset[0] = make_pair("lambda", lambda_buffer);
    dataset[1] = make_pair("rc_mfe", F_buffer);
    dataset[2] = make_pair("rc_CAI", CAI_buffer);
    dataset[3] = make_pair("rc_sCAI", stand_CAI);
    dataset[4] = make_pair('O', O_buffer);
    dataset[5] = make_pair("mfe", MFE_buffer);
    dataset[6] = make_pair("CAI", C_buffer);
    write_csv(outfile + ".csv", dataset);
    cout << "swipe done" << endl;
}